

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memmon.cpp
# Opt level: O2

void __thiscall memmon::get_hardware_info(memmon *this,json *hw_json)

{
  value_t vVar1;
  json_value jVar2;
  pointer pbVar3;
  char cVar4;
  int iVar5;
  istream *piVar6;
  long lVar7;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *this_00;
  reference pvVar8;
  pointer pbVar9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string line;
  data local_2f0;
  string val;
  long local_2b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  metrics;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  key_type local_258;
  ifstream memInfoFile;
  
  std::ifstream::ifstream(&memInfoFile,"/proc/meminfo",_S_in);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    std::__cxx11::string::string((string *)&line,"Failed to open /proc/meminfo",(allocator *)&val);
    MessageBase::error(&this->super_MessageBase,&line);
    std::__cxx11::string::~string((string *)&line);
  }
  else {
    std::__cxx11::string::string((string *)&line,"MemTotal",(allocator *)&val);
    __l._M_len = 1;
    __l._M_array = &line;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&metrics,__l,(allocator_type *)&local_278);
    std::__cxx11::string::~string((string *)&line);
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while (piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)&memInfoFile,(string *)&line),
          ((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
      if (line._M_string_length != 0) {
        lVar7 = std::__cxx11::string::find((char *)&line,0x1b2f9a);
        val._M_dataplus._M_p = (pointer)&val.field_2;
        val._M_string_length = 0;
        val.field_2._M_local_buf[0] = '\0';
        if (lVar7 != -1) {
          std::__cxx11::string::substr((ulong)&local_278,(ulong)&line);
          std::__cxx11::string::operator=((string *)&val,(string *)&local_278);
          std::__cxx11::string::~string((string *)&local_278);
          pbVar3 = metrics.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar9 = metrics.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (val._M_string_length != 0) {
            for (; pbVar9 != pbVar3; pbVar9 = pbVar9 + 1) {
              if (((string *)pbVar9->_M_string_length <= line._M_string_length) &&
                 (iVar5 = std::__cxx11::string::compare
                                    ((ulong)&line,0,(string *)pbVar9->_M_string_length), iVar5 == 0)
                 ) {
                std::__cxx11::string::substr((ulong)&local_278,(ulong)&val);
                std::__cxx11::string::operator=((string *)&val,(string *)&local_278);
                std::__cxx11::string::~string((string *)&local_278);
                std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                          (&local_298,"^\\s+|\\s+$",0x10);
                std::
                regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
                          (&local_278,&val,&local_298,"",0);
                local_2b8 = std::__cxx11::stol(&local_278,(size_t *)0x0,10);
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::basic_json<long,_long,_0>
                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)&local_2f0,&local_2b8);
                this_00 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)nlohmann::json_abi_v3_11_3::
                             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             ::operator[]<char_const>
                                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                         *)hw_json,"HW");
                pvVar8 = nlohmann::json_abi_v3_11_3::
                         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         ::operator[]<char_const>(this_00,"mem");
                std::__cxx11::string::string((string *)&local_258,(string *)pbVar9);
                pvVar8 = nlohmann::json_abi_v3_11_3::
                         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         ::operator[](pvVar8,&local_258);
                vVar1 = (pvVar8->m_data).m_type;
                (pvVar8->m_data).m_type = local_2f0.m_type;
                jVar2 = (pvVar8->m_data).m_value;
                (pvVar8->m_data).m_value = local_2f0.m_value;
                local_2f0.m_type = vVar1;
                local_2f0.m_value = jVar2;
                std::__cxx11::string::~string((string *)&local_258);
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::data::~data(&local_2f0);
                std::__cxx11::string::~string((string *)&local_278);
                std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                          (&local_298);
              }
            }
          }
        }
        std::__cxx11::string::~string((string *)&val);
      }
    }
    std::ifstream::close();
    std::__cxx11::string::~string((string *)&line);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&metrics);
  }
  std::ifstream::~ifstream(&memInfoFile);
  return;
}

Assistant:

void const memmon::get_hardware_info(nlohmann::json& hw_json) {
  // Read some information from /proc/meminfo
  std::ifstream memInfoFile{"/proc/meminfo"};
  if (!memInfoFile.is_open()) {
    error("Failed to open /proc/meminfo");
    return;
  }

  // Metrics to read from the input
  std::vector<std::string> metrics{"MemTotal"};

  // Loop over the file
  std::string line;
  while (std::getline(memInfoFile, line)) {
    if (line.empty()) continue;
    size_t splitIdx = line.find(":");
    std::string val;
    if (splitIdx != std::string::npos) {
      val = line.substr(splitIdx + 1);
      if (val.empty()) continue;
      for (const auto& metric : metrics) {
        if (line.size() >= metric.size() &&
            line.compare(0, metric.size(), metric) == 0) {
          val = val.substr(0, val.size() - 3);  // strip the trailing kB
          hw_json["HW"]["mem"][metric] =
              std::stol(std::regex_replace(val, std::regex("^\\s+|\\s+$"), ""));
        }  // end of metric check
      }    // end of populating metrics
    }      // end of seperator check
  }        // end of reading memInfoFile

  // Close the file
  memInfoFile.close();

  return;
}